

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogMessageCompact.h
# Opt level: O0

void __thiscall
nowtech::log::MessageCompact<8ul,true>::
output<nowtech::log::ConverterCustomText<nowtech::log::MessageCompact<8ul,true>,true,(unsigned_char)100,true,false>>
          (MessageCompact<8UL,_true> *this,
          ConverterCustomText<nowtech::log::MessageCompact<8UL,_true>,_true,_(unsigned_char)_d_,_true,_false>
          *aConverter)

{
  char cVar1;
  undefined8 *in_RDI;
  double value_11;
  float value_10;
  int64_t value_9;
  uint64_t value_8;
  char *value_7;
  char value_6;
  int32_t value_5;
  int16_t value_4;
  int8_t value_3;
  uint32_t value_2;
  uint16_t value_1;
  bool value;
  uint8_t fill;
  uint8_t base;
  Type type;
  uint8_t aFill;
  uint8_t aBase;
  uint8_t aFill_00;
  uint8_t uVar2;
  uint8_t aValue_01;
  uint16_t aValue_00;
  uint32_t aValue;
  uint8_t uVar3;
  ConverterCustomText<nowtech::log::MessageCompact<8UL,_true>,_true,_(unsigned_char)_d_,_true,_false>
  *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbc;
  uint8_t in_stack_ffffffffffffffbd;
  uint8_t in_stack_ffffffffffffffbe;
  bool in_stack_ffffffffffffffbf;
  ConverterCustomText<nowtech::log::MessageCompact<8UL,_true>,_true,_(unsigned_char)_d_,_true,_false>
  *in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffc8;
  ConverterCustomText<nowtech::log::MessageCompact<8UL,_true>,_true,_(unsigned_char)_d_,_true,_false>
  *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  undefined2 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe2;
  undefined1 in_stack_ffffffffffffffe3;
  undefined4 in_stack_ffffffffffffffe4;
  
  cVar1 = *(char *)((long)in_RDI + 0xc);
  if (cVar1 == '\x02') {
    ConverterCustomText<nowtech::log::MessageCompact<8UL,_true>,_true,_(unsigned_char)'d',_true,_false>
    ::convert(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbf,in_stack_ffffffffffffffbe,
              in_stack_ffffffffffffffbd);
  }
  else {
    uVar2 = (uint8_t)((ulong)in_RDI >> 0x30);
    aValue_01 = (uint8_t)((ulong)in_RDI >> 0x38);
    uVar3 = (uint8_t)((ulong)in_RDI >> 0x28);
    if (cVar1 == '\x06') {
      ConverterCustomText<nowtech::log::MessageCompact<8UL,_true>,_true,_(unsigned_char)'d',_true,_false>
      ::convert(in_stack_ffffffffffffffb0,aValue_01,uVar2,uVar3);
    }
    else {
      aFill_00 = (uint8_t)((ulong)in_RDI >> 0x20);
      aValue_00 = (uint16_t)((ulong)in_RDI >> 0x30);
      if (cVar1 == '\a') {
        ConverterCustomText<nowtech::log::MessageCompact<8UL,_true>,_true,_(unsigned_char)'d',_true,_false>
        ::convert(in_stack_ffffffffffffffb0,aValue_00,uVar3,aFill_00);
      }
      else {
        aFill = (uint8_t)((ulong)in_RDI >> 0x10);
        aBase = (uint8_t)((ulong)in_RDI >> 0x18);
        aValue = (uint32_t)((ulong)in_RDI >> 0x20);
        if (cVar1 == '\b') {
          ConverterCustomText<nowtech::log::MessageCompact<8UL,_true>,_true,_(unsigned_char)'d',_true,_false>
          ::convert(in_stack_ffffffffffffffb0,aValue,aBase,aFill);
        }
        else if (cVar1 == '\n') {
          ConverterCustomText<nowtech::log::MessageCompact<8UL,_true>,_true,_(unsigned_char)'d',_true,_false>
          ::convert(in_stack_ffffffffffffffb0,aValue_01,uVar2,uVar3);
        }
        else if (cVar1 == '\v') {
          ConverterCustomText<nowtech::log::MessageCompact<8UL,_true>,_true,_(unsigned_char)'d',_true,_false>
          ::convert(in_stack_ffffffffffffffb0,aValue_00,uVar3,aFill_00);
        }
        else if (cVar1 == '\f') {
          ConverterCustomText<nowtech::log::MessageCompact<8UL,_true>,_true,_(unsigned_char)'d',_true,_false>
          ::convert(in_stack_ffffffffffffffb0,aValue,aBase,aFill);
        }
        else if (cVar1 == '\x0e') {
          ConverterCustomText<nowtech::log::MessageCompact<8UL,_true>,_true,_(unsigned_char)'d',_true,_false>
          ::convert(in_stack_ffffffffffffffb0,aValue_01,uVar2,uVar3);
        }
        else {
          uVar3 = (uint8_t)((ulong)in_stack_ffffffffffffffb0 >> 0x30);
          uVar2 = (uint8_t)((ulong)in_stack_ffffffffffffffb0 >> 0x38);
          if (cVar1 == '\x0f') {
            ConverterCustomText<nowtech::log::MessageCompact<8UL,_true>,_true,_(unsigned_char)'d',_true,_false>
            ::convert(in_stack_ffffffffffffffc0,
                      (char *)CONCAT17(in_stack_ffffffffffffffbf,
                                       CONCAT16(in_stack_ffffffffffffffbe,
                                                CONCAT15(in_stack_ffffffffffffffbd,
                                                         CONCAT14(in_stack_ffffffffffffffbc,
                                                                  in_stack_ffffffffffffffb8)))),
                      uVar2,uVar3);
          }
          else if (cVar1 == '\x10') {
            ConverterCustomText<nowtech::log::MessageCompact<8UL,_true>,_true,_(unsigned_char)'d',_true,_false>
            ::convert(in_stack_ffffffffffffffc0,
                      (char *)CONCAT17(in_stack_ffffffffffffffbf,
                                       CONCAT16(in_stack_ffffffffffffffbe,
                                                CONCAT15(in_stack_ffffffffffffffbd,
                                                         CONCAT14(in_stack_ffffffffffffffbc,
                                                                  in_stack_ffffffffffffffb8)))),
                      uVar2,uVar3);
          }
          else {
            if (cVar1 == '\t') {
              in_stack_ffffffffffffffc8 = *in_RDI;
              ConverterCustomText<nowtech::log::MessageCompact<8UL,_true>,_true,_(unsigned_char)'d',_true,_false>
              ::convert(in_stack_ffffffffffffffc0,
                        CONCAT17(in_stack_ffffffffffffffbf,
                                 CONCAT16(in_stack_ffffffffffffffbe,
                                          CONCAT15(in_stack_ffffffffffffffbd,
                                                   CONCAT14(in_stack_ffffffffffffffbc,
                                                            in_stack_ffffffffffffffb8)))),uVar2,
                        uVar3);
            }
            else if (cVar1 == '\r') {
              ConverterCustomText<nowtech::log::MessageCompact<8UL,_true>,_true,_(unsigned_char)'d',_true,_false>
              ::convert((ConverterCustomText<nowtech::log::MessageCompact<8UL,_true>,_true,_(unsigned_char)_d_,_true,_false>
                         *)*in_RDI,
                        CONCAT17(in_stack_ffffffffffffffbf,
                                 CONCAT16(in_stack_ffffffffffffffbe,
                                          CONCAT15(in_stack_ffffffffffffffbd,
                                                   CONCAT14(in_stack_ffffffffffffffbc,
                                                            in_stack_ffffffffffffffb8)))),uVar2,
                        uVar3);
            }
            if (cVar1 == '\x03') {
              ConverterCustomText<nowtech::log::MessageCompact<8UL,_true>,_true,_(unsigned_char)'d',_true,_false>
              ::convert<void>(in_stack_ffffffffffffffd0,
                              (float)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
                              (uint8_t)((ulong)in_stack_ffffffffffffffc8 >> 0x18),
                              (uint8_t)((ulong)in_stack_ffffffffffffffc8 >> 0x10));
            }
            if (cVar1 == '\x04') {
              ConverterCustomText<nowtech::log::MessageCompact<8UL,_true>,_true,_(unsigned_char)'d',_true,_false>
              ::convert<void>((ConverterCustomText<nowtech::log::MessageCompact<8UL,_true>,_true,_(unsigned_char)_d_,_true,_false>
                               *)CONCAT44(in_stack_ffffffffffffffe4,
                                          CONCAT13(in_stack_ffffffffffffffe3,
                                                   CONCAT12(in_stack_ffffffffffffffe2,
                                                            in_stack_ffffffffffffffe0))),
                              (double)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                              (uint8_t)((ulong)in_stack_ffffffffffffffd0 >> 0x38),
                              (uint8_t)((ulong)in_stack_ffffffffffffffd0 >> 0x30));
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void output(tConverter& aConverter) const noexcept {
    Type type = static_cast<Type>(mData[csOffsetType]);
    uint8_t base = mData[csOffsetBase];
    uint8_t fill = mData[csOffsetFill];

    if(type == Type::cBool) {
      bool value;
      std::memcpy(&value, mData + csOffsetPayload, sizeof(value));
      aConverter.convert(value, base, fill);
    }
    else if(type == Type::cUint8_t) {
      aConverter.convert(mData[csOffsetPayload], base, fill);
    }
    else if(type == Type::cUint16_t) {
      uint16_t value;
      std::memcpy(&value, mData + csOffsetPayload, sizeof(value));
      aConverter.convert(value, base, fill);
    }
    else if(type == Type::cUint32_t) {
      uint32_t value;
      std::memcpy(&value, mData + csOffsetPayload, sizeof(value));
      aConverter.convert(value, base, fill);
    }
    else if(type == Type::cInt8_t) {
      int8_t value;
      std::memcpy(&value, mData + csOffsetPayload, sizeof(value));
      aConverter.convert(value, base, fill);
    }
    else if(type == Type::cInt16_t) {
      int16_t value;
      std::memcpy(&value, mData + csOffsetPayload, sizeof(value));
      aConverter.convert(value, base, fill);
    }
    else if(type == Type::cInt32_t) {
      int32_t value;
      std::memcpy(&value, mData + csOffsetPayload, sizeof(value));
      aConverter.convert(value, base, fill);
    }
    else if(type == Type::cChar) {
      char value;
      std::memcpy(&value, mData + csOffsetPayload, sizeof(value));
      aConverter.convert(value, base, fill);
    }
    else if(type == Type::cCharArray) {
      char* value;
      std::memcpy(&value, mData + csOffsetPayload, sizeof(value));
      aConverter.convert(value, base, fill);
    }
    else if(type == Type::cStoredChars) {
      aConverter.convert(reinterpret_cast<char const*>(mData + csOffsetPayload), base, fill);
    }
    else {
      if constexpr(csPayloadSize >= sizeof(int64_t) || sizeof(char*) > sizeof(int32_t)) {
        if(type == Type::cUint64_t) {
          uint64_t value;
          std::memcpy(&value, mData + csOffsetPayload, sizeof(value));
          aConverter.convert(value, base, fill);
        }
        else if(type == Type::cInt64_t) {
          int64_t value;
          std::memcpy(&value, mData + csOffsetPayload, sizeof(value));
          aConverter.convert(value, base, fill);
        }
        else { // nothing to do
        }
      }
      else { // nothing to do
      }
      if constexpr(tSupportFloatingPoint) {
        if(type == Type::cFloat) {
          float value;
          std::memcpy(&value, mData + csOffsetPayload, sizeof(value));
          aConverter.convert(value, base, fill);
        }
        else { // nothing to do
        }
        if constexpr(csPayloadSize >= sizeof(double)) {
          if(type == Type::cDouble) {
            double value;
            std::memcpy(&value, mData + csOffsetPayload, sizeof(value));
            aConverter.convert(value, base, fill);
          }
          else { // nothing to do
          }
          if constexpr(csPayloadSize >= sizeof(long double)) {
            if(type == Type::cLongDouble) {
              long double value;
              std::memcpy(&value, mData + csOffsetPayload, sizeof(value));
              aConverter.convert(value, base, fill);
            }
            else { // nothing to do
            }
          }
          else { // nothing to do
          }
        }
        else { // nothing to do
        }
      }
      else { // nothing to do
      }
    }
  }